

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O3

int has_wext(int sock_fd,char *device,char *ebuf)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  iwreq ireq;
  char local_40 [15];
  undefined1 local_31;
  
  strncpy(local_40,device,0x10);
  local_31 = 0;
  iVar1 = ioctl(sock_fd,0x8b01,local_40);
  iVar2 = 1;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = pcap_strerror(*piVar3);
    snprintf(ebuf,0x100,"%s: SIOCGIWNAME: %s",device,pcVar4);
    iVar2 = (uint)(*piVar3 != 0x13) * 5 + -5;
  }
  return iVar2;
}

Assistant:

static int
has_wext(int sock_fd, const char *device, char *ebuf)
{
	struct iwreq ireq;

	if (is_bonding_device(sock_fd, device))
		return 0;	/* bonding device, so don't even try */

	strlcpy(ireq.ifr_ifrn.ifrn_name, device,
	    sizeof ireq.ifr_ifrn.ifrn_name);
	if (ioctl(sock_fd, SIOCGIWNAME, &ireq) >= 0)
		return 1;	/* yes */
	pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
	    "%s: SIOCGIWNAME: %s", device, pcap_strerror(errno));
	if (errno == ENODEV)
		return PCAP_ERROR_NO_SUCH_DEVICE;
	return 0;
}